

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O3

char __thiscall TTTBoard::PrintCell(TTTBoard *this,CellType cell)

{
  char cVar1;
  char cVar2;
  
  cVar2 = ' ';
  if (cell == OHS) {
    cVar2 = 'O';
  }
  cVar1 = 'X';
  if (cell != EXXES) {
    cVar1 = cVar2;
  }
  return cVar1;
}

Assistant:

char TTTBoard::PrintCell(CellType cell) const
{
    char cellchar = ' ';

    if(cell == EXXES)
        cellchar = 'X';
    else if (cell == OHS)
        cellchar = 'O';

    return cellchar;
}